

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O1

void __thiscall Js::SCAPropBag::SCAPropBag(SCAPropBag *this,ScriptContext *scriptContext)

{
  Recycler *this_00;
  Recycler *alloc;
  BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
  *ptr;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  (this->super_ScriptContextHolder).m_scriptContext = scriptContext;
  (this->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_01559c98;
  (this->m_properties).ptr =
       (BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
        *)0x0;
  this->m_refCount = 1;
  this_00 = scriptContext->recycler;
  local_40 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<Js::InternalString,void*,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_ad68f1c;
  data.filename._0_4_ = 0x1b;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_40);
  ptr = (BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>
         *)new<Memory::Recycler>(0x38,alloc,0x38bbb2);
  (ptr->buckets).ptr = (int *)0x0;
  (ptr->entries).ptr = (DictionaryEntry<Js::InternalString,_Memory::WriteBarrierPtr<void>_> *)0x0;
  ptr->alloc = this_00;
  ptr->size = 0;
  ptr->bucketCount = 0;
  ptr->count = 0;
  ptr->freeCount = 0;
  ptr->modFunctionIndex = 0x4b;
  ptr->stats = (Type)0x0;
  Memory::
  RecyclerRootPtr<JsUtil::BaseDictionary<Js::InternalString,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::DictionaryEntry,_JsUtil::NoResizeLock>_>
  ::Root(&this->m_properties,ptr,this_00);
  return;
}

Assistant:

SCAPropBag::SCAPropBag(ScriptContext* scriptContext)
        : ScriptContextHolder(scriptContext), m_refCount(1)
    {
        Recycler* recycler = GetScriptContext()->GetRecycler();
        m_properties.Root(RecyclerNew(recycler, PropertyDictionary, recycler), recycler);        
    }